

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtCountOnesVecMask(word *x,word *pMask,int nWords,int fCompl)

{
  int iVar1;
  int local_28;
  int local_24;
  int Count;
  int w;
  int fCompl_local;
  int nWords_local;
  word *pMask_local;
  word *x_local;
  
  local_28 = 0;
  if (fCompl == 0) {
    for (local_24 = 0; local_24 < nWords; local_24 = local_24 + 1) {
      iVar1 = Abc_TtCountOnes(pMask[local_24] & x[local_24]);
      local_28 = iVar1 + local_28;
    }
  }
  else {
    for (local_24 = 0; local_24 < nWords; local_24 = local_24 + 1) {
      iVar1 = Abc_TtCountOnes(pMask[local_24] & (x[local_24] ^ 0xffffffffffffffff));
      local_28 = iVar1 + local_28;
    }
  }
  return local_28;
}

Assistant:

static inline int Abc_TtCountOnesVecMask( word * x, word * pMask, int nWords, int fCompl )
{
    int w, Count = 0;
    if ( fCompl )
        for ( w = 0; w < nWords; w++ )
            Count += Abc_TtCountOnes( pMask[w] & ~x[w] );
    else
        for ( w = 0; w < nWords; w++ )
            Count += Abc_TtCountOnes( pMask[w] & x[w] );
    return Count;
}